

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ReplicatedAssignmentPatternSyntax::ReplicatedAssignmentPatternSyntax
          (ReplicatedAssignmentPatternSyntax *this,Token openBrace,ExpressionSyntax *countExpr,
          Token innerOpenBrace,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,
          Token innerCloseBrace,Token closeBrace)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar6 = innerOpenBrace._0_8_;
  uVar5 = openBrace._0_8_;
  (this->super_AssignmentPatternSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_AssignmentPatternSyntax).super_SyntaxNode.kind = ReplicatedAssignmentPattern;
  (this->openBrace).kind = (short)uVar5;
  (this->openBrace).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBrace).info = openBrace.info;
  (this->countExpr).ptr = countExpr;
  (this->innerOpenBrace).kind = (short)uVar6;
  (this->innerOpenBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->innerOpenBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->innerOpenBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->innerOpenBrace).info = innerOpenBrace.info;
  SVar2 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b090;
  sVar1 = (items->elements).size_;
  (this->items).elements.data_ = (items->elements).data_;
  (this->items).elements.size_ = sVar1;
  (this->innerCloseBrace).kind = innerCloseBrace.kind;
  (this->innerCloseBrace).field_0x2 = innerCloseBrace._2_1_;
  (this->innerCloseBrace).numFlags = (NumericTokenFlags)innerCloseBrace.numFlags.raw;
  (this->innerCloseBrace).rawLen = innerCloseBrace.rawLen;
  (this->innerCloseBrace).info = innerCloseBrace.info;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  (countExpr->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->items).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[](&this->items,index);
      (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

ReplicatedAssignmentPatternSyntax(Token openBrace, ExpressionSyntax& countExpr, Token innerOpenBrace, const SeparatedSyntaxList<ExpressionSyntax>& items, Token innerCloseBrace, Token closeBrace) :
        AssignmentPatternSyntax(SyntaxKind::ReplicatedAssignmentPattern), openBrace(openBrace), countExpr(&countExpr), innerOpenBrace(innerOpenBrace), items(items), innerCloseBrace(innerCloseBrace), closeBrace(closeBrace) {
        this->countExpr->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }